

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall Dice::diceHistoricalResolvedValues(Dice *this)

{
  pointer pmVar1;
  char *__s;
  long *plVar2;
  ostream *poVar3;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar4;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dice container values for player ",0x21);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->playerNumber);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-----------------------------------------------------------------",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  pmVar1 = (this->historyOfResolvedRolls).
           super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->it)._M_current = pmVar1;
  if (pmVar1 != (this->historyOfResolvedRolls).
                super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dice Roll # ",0xc);
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-----------------------------------------------------------------",0x41);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      pmVar4 = (this->it)._M_current;
      p_Var6 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var6 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
        __s = this->DiceNames[p_Var6[1]._M_color];
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1281d0);
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        plVar2 = (long *)std::ostream::operator<<
                                   ((ostream *)&std::cout,*(int *)&p_Var6[1].field_0x4);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        pmVar4 = (this->it)._M_current;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-----------------------------------------------------------------",0x41);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      pmVar4 = (this->it)._M_current + 1;
      (this->it)._M_current = pmVar4;
    } while (pmVar4 != (this->historyOfResolvedRolls).
                       super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Dice::diceHistoricalResolvedValues()
{
    cout << "Dice container values for player "<< this->getPlayerNumber() << endl;
    cout << "-----------------------------------------------------------------" << endl;
    for (it = historyOfResolvedRolls.begin(); it != historyOfResolvedRolls.end(); ++it) {
        cout << "Dice Roll # "<< it - historyOfResolvedRolls.begin() +1 << endl;
        cout << "-----------------------------------------------------------------" << endl;

        for (auto mapIt(it->begin()); mapIt != it->end(); ++mapIt) {

            std::cout << DiceNames[mapIt->first] << ", " << mapIt->second << std::endl;
        }
        cout << "-----------------------------------------------------------------" << endl;

    }

}